

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LangevinPiston.cpp
# Opt level: O3

void __thiscall OpenMD::LangevinPiston::moveB(LangevinPiston *this)

{
  undefined8 *puVar1;
  double *pdVar2;
  double dVar3;
  pointer ppSVar4;
  pointer pVVar5;
  pointer pVVar6;
  Snapshot *pSVar7;
  RealType RVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  Thermo *this_00;
  uint i_2;
  uint uVar11;
  Molecule *pMVar12;
  undefined1 *puVar13;
  uint i_1;
  long lVar14;
  StuntDouble *pSVar15;
  long lVar16;
  int iVar17;
  long lVar18;
  pointer ppSVar19;
  ulong uVar20;
  Vector<double,_3U> result_3;
  MoleculeIterator i;
  Vector<double,_3U> result_1;
  Vector<double,_3U> result_2;
  Vector<double,_3U> result;
  Vector3d sc;
  Vector3d ji;
  Vector3d Tb;
  Vector3d local_158;
  MoleculeIterator local_140;
  double local_138 [3];
  Thermo *local_120;
  ulong local_118;
  double local_110;
  double local_108 [4];
  double local_e8 [4];
  double local_c8 [4];
  double local_a8;
  double dStack_a0;
  double local_98;
  Vector3d local_88;
  double local_68 [4];
  double local_48;
  double dStack_40;
  double local_38;
  
  iVar17 = 0;
  local_140._M_node = (_Base_ptr)0x0;
  local_88.super_Vector<double,_3U>.data_[2] = 0.0;
  local_88.super_Vector<double,_3U>.data_[0] = 0.0;
  local_88.super_Vector<double,_3U>.data_[1] = 0.0;
  local_98 = 0.0;
  local_a8 = 0.0;
  dStack_a0 = 0.0;
  local_c8[2] = 0.0;
  local_c8[0] = 0.0;
  local_c8[1] = 0.0;
  (*(this->super_NPT).super_VelocityVerletIntegrator.super_Integrator._vptr_Integrator[0x18])();
  pMVar12 = SimInfo::beginMolecule
                      ((this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.info_,
                       &local_140);
  if (pMVar12 != (Molecule *)0x0) {
    do {
      ppSVar19 = (pMVar12->integrableObjects_).
                 super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      ppSVar4 = (pMVar12->integrableObjects_).
                super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      if ((ppSVar19 != ppSVar4) && (pSVar15 = *ppSVar19, pSVar15 != (StuntDouble *)0x0)) {
        pVVar5 = (this->super_NPT).oldVel.
                 super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pVVar6 = (this->super_NPT).oldJi.
                 super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar16 = (long)iVar17 * 0x18;
        do {
          iVar17 = iVar17 + 1;
          ppSVar19 = ppSVar19 + 1;
          pSVar7 = pSVar15->snapshotMan_->currentSnapshot_;
          lVar18 = (long)pSVar15->localIndex_;
          lVar14 = *(long *)((long)&(pSVar7->atomData).velocity.
                                    super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + pSVar15->storage_);
          puVar1 = (undefined8 *)(lVar14 + lVar18 * 0x18);
          uVar9 = *puVar1;
          uVar10 = puVar1[1];
          *(undefined8 *)((long)(pVVar5->super_Vector<double,_3U>).data_ + lVar16 + 0x10) =
               *(undefined8 *)(lVar14 + 0x10 + lVar18 * 0x18);
          puVar1 = (undefined8 *)((long)(pVVar5->super_Vector<double,_3U>).data_ + lVar16);
          *puVar1 = uVar9;
          puVar1[1] = uVar10;
          if (pSVar15->objType_ - otDAtom < 2) {
            lVar14 = *(long *)((long)&(pSVar7->atomData).angularMomentum.
                                      super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start + pSVar15->storage_)
            ;
            puVar1 = (undefined8 *)(lVar14 + lVar18 * 0x18);
            uVar9 = *puVar1;
            uVar10 = puVar1[1];
            *(undefined8 *)((long)(pVVar6->super_Vector<double,_3U>).data_ + lVar16 + 0x10) =
                 *(undefined8 *)(lVar14 + 0x10 + lVar18 * 0x18);
            puVar1 = (undefined8 *)((long)(pVVar6->super_Vector<double,_3U>).data_ + lVar16);
            *puVar1 = uVar9;
            puVar1[1] = uVar10;
          }
          if (ppSVar19 == ppSVar4) break;
          pSVar15 = *ppSVar19;
          lVar16 = lVar16 + 0x18;
        } while (pSVar15 != (StuntDouble *)0x0);
      }
      pMVar12 = SimInfo::nextMolecule
                          ((this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.info_,
                           &local_140);
    } while (pMVar12 != (Molecule *)0x0);
  }
  local_120 = &(this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.thermo;
  RVar8 = Thermo::getVolume(local_120);
  (this->super_NPT).instaVol = RVar8;
  if (0 < (this->super_NPT).maxIterNum_) {
    uVar20 = 0;
    do {
      this_00 = local_120;
      local_118 = uVar20;
      RVar8 = Thermo::getTemperature(local_120);
      (this->super_NPT).instaTemp = RVar8;
      RVar8 = Thermo::getPressure(this_00);
      (this->super_NPT).instaPress = RVar8;
      (*(this->super_NPT).super_VelocityVerletIntegrator.super_Integrator._vptr_Integrator[0x16])
                (this);
      (*(this->super_NPT).super_VelocityVerletIntegrator.super_Integrator._vptr_Integrator[0x13])
                (this);
      pMVar12 = SimInfo::beginMolecule
                          ((this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.info_,
                           &local_140);
      if (pMVar12 != (Molecule *)0x0) {
        uVar20 = 0;
        do {
          ppSVar19 = (pMVar12->integrableObjects_).
                     super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          if ((ppSVar19 !=
               (pMVar12->integrableObjects_).
               super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
               _M_impl.super__Vector_impl_data._M_finish) &&
             (pSVar15 = *ppSVar19, pSVar15 != (StuntDouble *)0x0)) {
            uVar20 = (ulong)(int)uVar20;
            lVar16 = uVar20 * 0x18;
            do {
              lVar14 = *(long *)((long)&(pSVar15->snapshotMan_->currentSnapshot_->atomData).force.
                                        super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start +
                                pSVar15->storage_);
              local_68[2] = *(double *)(lVar14 + 0x10 + (long)pSVar15->localIndex_ * 0x18);
              pdVar2 = (double *)(lVar14 + (long)pSVar15->localIndex_ * 0x18);
              local_68[0] = *pdVar2;
              local_68[1] = pdVar2[1];
              local_110 = pSVar15->mass_;
              (*(this->super_NPT).super_VelocityVerletIntegrator.super_Integrator._vptr_Integrator
                [0x11])(this,local_c8,uVar20 & 0xffffffff);
              pVVar5 = (this->super_NPT).oldVel.
                       super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              dVar3 = (this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.dt2;
              local_e8[0] = 0.0;
              local_e8[1] = 0.0;
              local_e8[2] = 0.0;
              lVar14 = 0;
              do {
                local_e8[lVar14] = local_68[lVar14] * ((dVar3 * 0.0004184) / local_110);
                lVar14 = lVar14 + 1;
              } while (lVar14 != 3);
              local_138[0] = 0.0;
              local_138[1] = 0.0;
              local_138[2] = 0.0;
              lVar14 = 0;
              do {
                local_138[lVar14] =
                     *(double *)
                      ((long)(pVVar5->super_Vector<double,_3U>).data_ + lVar14 * 8 + lVar16) +
                     local_e8[lVar14];
                lVar14 = lVar14 + 1;
              } while (lVar14 != 3);
              local_108[0] = 0.0;
              local_108[1] = 0.0;
              local_108[2] = 0.0;
              lVar14 = 0;
              do {
                local_108[lVar14] = local_c8[lVar14] * dVar3;
                lVar14 = lVar14 + 1;
              } while (lVar14 != 3);
              local_158.super_Vector<double,_3U>.data_[0] = 0.0;
              local_158.super_Vector<double,_3U>.data_[1] = 0.0;
              local_158.super_Vector<double,_3U>.data_[2] = 0.0;
              lVar14 = 0;
              do {
                local_158.super_Vector<double,_3U>.data_[lVar14] =
                     local_138[lVar14] - local_108[lVar14];
                lVar14 = lVar14 + 1;
              } while (lVar14 != 3);
              local_38 = local_158.super_Vector<double,_3U>.data_[2];
              local_48 = local_158.super_Vector<double,_3U>.data_[0];
              dStack_40 = local_158.super_Vector<double,_3U>.data_[1];
              pSVar7 = pSVar15->snapshotMan_->currentSnapshot_;
              lVar18 = (long)pSVar15->localIndex_;
              lVar14 = *(long *)((long)&(pSVar7->atomData).velocity.
                                        super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start +
                                pSVar15->storage_);
              *(double *)(lVar14 + 0x10 + lVar18 * 0x18) =
                   local_158.super_Vector<double,_3U>.data_[2];
              pdVar2 = (double *)(lVar14 + lVar18 * 0x18);
              *pdVar2 = local_158.super_Vector<double,_3U>.data_[0];
              pdVar2[1] = local_158.super_Vector<double,_3U>.data_[1];
              if (pSVar15->objType_ - otDAtom < 2) {
                puVar13 = (undefined1 *)
                          (lVar18 * 0x18 +
                          *(long *)((long)&(pSVar7->atomData).torque.
                                           super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start +
                                   pSVar15->storage_));
                local_158.super_Vector<double,_3U>.data_[0] = 0.0;
                local_158.super_Vector<double,_3U>.data_[1] = 0.0;
                local_158.super_Vector<double,_3U>.data_[2] = 0.0;
                if ((Vector3d *)puVar13 != &local_158) {
                  lVar14 = 0;
                  do {
                    local_158.super_Vector<double,_3U>.data_[lVar14] =
                         *(double *)(puVar13 + lVar14 * 8);
                    lVar14 = lVar14 + 1;
                  } while (lVar14 != 3);
                }
                StuntDouble::lab2Body(&local_88,pSVar15,&local_158);
                pVVar5 = (this->super_NPT).oldJi.
                         super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                dVar3 = (this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.dt2;
                local_138[0] = 0.0;
                local_138[1] = 0.0;
                local_138[2] = 0.0;
                lVar14 = 0;
                do {
                  local_138[lVar14] =
                       local_88.super_Vector<double,_3U>.data_[lVar14] * dVar3 * 0.0004184;
                  lVar14 = lVar14 + 1;
                } while (lVar14 != 3);
                local_158.super_Vector<double,_3U>.data_[0] = 0.0;
                local_158.super_Vector<double,_3U>.data_[1] = 0.0;
                local_158.super_Vector<double,_3U>.data_[2] = 0.0;
                lVar14 = 0;
                do {
                  local_158.super_Vector<double,_3U>.data_[lVar14] =
                       *(double *)
                        ((long)(pVVar5->super_Vector<double,_3U>).data_ + lVar14 * 8 + lVar16) +
                       local_138[lVar14];
                  lVar14 = lVar14 + 1;
                } while (lVar14 != 3);
                local_98 = local_158.super_Vector<double,_3U>.data_[2];
                local_a8 = local_158.super_Vector<double,_3U>.data_[0];
                dStack_a0 = local_158.super_Vector<double,_3U>.data_[1];
                iVar17 = pSVar15->localIndex_;
                lVar14 = *(long *)((long)&(pSVar15->snapshotMan_->currentSnapshot_->atomData).
                                          angularMomentum.
                                          super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start +
                                  pSVar15->storage_);
                *(double *)(lVar14 + 0x10 + (long)iVar17 * 0x18) =
                     local_158.super_Vector<double,_3U>.data_[2];
                pdVar2 = (double *)(lVar14 + (long)iVar17 * 0x18);
                *pdVar2 = local_158.super_Vector<double,_3U>.data_[0];
                pdVar2[1] = local_158.super_Vector<double,_3U>.data_[1];
              }
              uVar20 = uVar20 + 1;
              ppSVar19 = ppSVar19 + 1;
              if (ppSVar19 ==
                  (pMVar12->integrableObjects_).
                  super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish) break;
              pSVar15 = *ppSVar19;
              lVar16 = lVar16 + 0x18;
            } while (pSVar15 != (StuntDouble *)0x0);
          }
          pMVar12 = SimInfo::nextMolecule
                              ((this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.
                               info_,&local_140);
        } while (pMVar12 != (Molecule *)0x0);
      }
      Rattle::constraintB((this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.rattle_)
      ;
      iVar17 = (*(this->super_NPT).super_VelocityVerletIntegrator.super_Integrator._vptr_Integrator
                 [0x14])(this);
    } while (((char)iVar17 == '\0') &&
            (uVar11 = (int)local_118 + 1, uVar20 = (ulong)uVar11,
            (int)uVar11 < (this->super_NPT).maxIterNum_));
  }
  (*((this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.flucQ_)->
    _vptr_FluctuatingChargePropagator[6])();
  (*(this->super_NPT).super_VelocityVerletIntegrator.super_Integrator._vptr_Integrator[0x19])(this);
  return;
}

Assistant:

void LangevinPiston::moveB(void) {
    SimInfo::MoleculeIterator i;
    Molecule::IntegrableObjectIterator j;
    Molecule* mol;
    StuntDouble* sd;
    int index;
    Vector3d Tb;
    Vector3d ji;
    Vector3d sc;
    Vector3d vel;
    Vector3d frc;
    RealType mass;

    loadEta();

    // save velocity and angular momentum
    index = 0;
    for (mol = info_->beginMolecule(i); mol != NULL;
         mol = info_->nextMolecule(i)) {
      for (sd = mol->beginIntegrableObject(j); sd != NULL;
           sd = mol->nextIntegrableObject(j)) {
        oldVel[index] = sd->getVel();

        if (sd->isDirectional()) oldJi[index] = sd->getJ();

        ++index;
      }
    }

    instaVol = thermo.getVolume();

    for (int k = 0; k < maxIterNum_; k++) {
      instaTemp  = thermo.getTemperature();
      instaPress = thermo.getPressure();

      // evolve eta
      this->evolveEtaB();
      this->calcVelScale();

      index = 0;
      for (mol = info_->beginMolecule(i); mol != NULL;
           mol = info_->nextMolecule(i)) {
        for (sd = mol->beginIntegrableObject(j); sd != NULL;
             sd = mol->nextIntegrableObject(j)) {
          frc  = sd->getFrc();
          mass = sd->getMass();

          getVelScaleB(sc, index);

          // velocity half step
          vel = oldVel[index] + dt2 * Constants::energyConvert / mass * frc -
                dt2 * sc;

          sd->setVel(vel);

          if (sd->isDirectional()) {
            // get and convert the torque to body frame
            Tb = sd->lab2Body(sd->getTrq());

            ji = oldJi[index] + dt2 * Constants::energyConvert * Tb;

            sd->setJ(ji);
          }

          ++index;
        }
      }

      rattle_->constraintB();
      if (this->etaConverged()) break;
    }

    flucQ_->moveB();
    saveEta();
  }